

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O3

int cuddZddSwapping(DdManager *table,int lower,int upper,Cudd_ReorderingType heuristic)

{
  DdHalfWord DVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *moves;
  DdNode *pDVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  DdHalfWord DVar14;
  DdHalfWord x;
  int iVar15;
  DdHalfWord y;
  DdHalfWord x_00;
  DdHalfWord DVar16;
  bool bVar17;
  DdHalfWord local_a0;
  uint local_88;
  
  iVar12 = upper - lower;
  if (iVar12 < 0) {
    return 1;
  }
  iVar15 = -1;
  iVar2 = 0;
LAB_0081aff6:
  if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
    if (lower <= upper) {
      puVar4 = &table->subtableZ[lower].keys;
      uVar11 = 0xffffffff;
      iVar13 = lower;
      do {
        if ((int)uVar11 < (int)*puVar4) {
          iVar15 = iVar13;
          uVar11 = *puVar4;
        }
        puVar4 = puVar4 + 0xe;
        iVar13 = iVar13 + 1;
      } while (upper + 1 != iVar13);
    }
    DVar16 = upper;
    if (upper - iVar15 != 0) {
      lVar5 = Cudd_Random();
      DVar16 = (int)(lVar5 % (long)(upper - iVar15)) + iVar15 + 1;
    }
    DVar14 = lower;
    if (0 < ~lower + iVar15) {
      do {
        uVar6 = Cudd_Random();
        DVar14 = (DdHalfWord)
                 ((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                 (long)(~lower + iVar15));
      } while (DVar14 == DVar16);
    }
  }
  else {
    lVar5 = Cudd_Random();
    lVar5 = lVar5 % (long)(ulong)(iVar12 + 1);
    do {
      lVar7 = Cudd_Random();
      lVar7 = lVar7 % (long)(ulong)(iVar12 + 1);
    } while (lVar5 == lVar7);
    DVar16 = (int)lVar7 + lower;
    DVar14 = (int)lVar5 + lower;
  }
  DVar1 = DVar16;
  if ((int)DVar16 < (int)DVar14) {
    DVar1 = DVar14;
  }
  uVar11 = table->keysZ;
  if ((int)DVar14 < (int)DVar16) {
    DVar16 = DVar14;
  }
  x = DVar1 - 1;
  pDVar9 = (DdNode *)0x0;
  DVar14 = DVar16;
  local_a0 = DVar1;
  local_88 = uVar11;
  do {
    x_00 = DVar14;
    y = x_00 + 1;
    DVar14 = local_a0;
    if (y == x) {
      iVar13 = cuddZddSwapInPlace(table,x_00,x);
      if ((iVar13 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
      goto LAB_0081b36b;
      pDVar8->index = x_00;
      pDVar8->ref = x;
      *(int *)((long)&pDVar8->next + 4) = iVar13;
      (pDVar8->type).kids.T = pDVar9;
      iVar13 = cuddZddSwapInPlace(table,x,local_a0);
      if ((iVar13 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
      goto LAB_0081b398;
      pDVar9->index = x;
      pDVar9->ref = local_a0;
      *(int *)((long)&pDVar9->next + 4) = iVar13;
      (pDVar9->type).kids.T = pDVar8;
      uVar3 = cuddZddSwapInPlace(table,x_00,x);
      pDVar8 = pDVar9;
      if ((uVar3 == 0) || (moves = cuddDynamicAllocNode(table), moves == (DdNode *)0x0))
      goto LAB_0081b398;
      moves->index = x_00;
      y = x;
    }
    else {
      uVar3 = cuddZddSwapInPlace(table,x_00,y);
      if (x_00 == x) {
        if ((uVar3 == 0) || (moves = cuddDynamicAllocNode(table), moves == (DdNode *)0x0)) {
LAB_0081b36b:
          pDVar8 = pDVar9;
          if (pDVar9 == (DdNode *)0x0) {
            return 0;
          }
          goto LAB_0081b398;
        }
        moves->index = x_00;
      }
      else {
        if ((uVar3 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
        goto LAB_0081b36b;
        pDVar8->index = x_00;
        pDVar8->ref = y;
        *(uint *)((long)&pDVar8->next + 4) = uVar3;
        (pDVar8->type).kids.T = pDVar9;
        uVar3 = cuddZddSwapInPlace(table,x,local_a0);
        if ((uVar3 == 0) || (moves = cuddDynamicAllocNode(table), moves == (DdNode *)0x0))
        goto LAB_0081b398;
        moves->index = x;
        pDVar9 = pDVar8;
        DVar14 = y;
        y = local_a0;
        x_00 = x;
      }
    }
    moves->ref = y;
    *(uint *)((long)&moves->next + 4) = uVar3;
    (moves->type).kids.T = pDVar9;
    x = x_00 - 1;
    if (((int)DVar1 <= (int)DVar14) ||
       ((double)(int)local_88 * table->maxGrowth < (double)(int)uVar3)) break;
    pDVar9 = moves;
    local_a0 = x_00;
    if ((int)uVar3 < (int)local_88) {
      local_88 = uVar3;
    }
  } while( true );
  if ((int)DVar16 < (int)x_00) {
    iVar13 = cuddZddSwapInPlace(table,x,x_00);
    pDVar8 = moves;
    if ((iVar13 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0)) {
LAB_0081b398:
      pDVar9 = table->nextFree;
      do {
        pDVar10 = pDVar8;
        pDVar8 = (pDVar10->type).kids.T;
        pDVar10->ref = 0;
        pDVar10->next = pDVar9;
        pDVar9 = pDVar10;
      } while (pDVar8 != (DdNode *)0x0);
      goto LAB_0081b3ba;
    }
    pDVar9->index = x;
    pDVar9->ref = x_00;
    *(int *)((long)&pDVar9->next + 4) = iVar13;
    (pDVar9->type).kids.T = moves;
    moves = pDVar9;
  }
  iVar13 = cuddZddSiftingBackward(table,(Move *)moves,uVar11);
  pDVar9 = table->nextFree;
  if (iVar13 == 0) goto LAB_0081b372;
  do {
    pDVar8 = moves;
    moves = (pDVar8->type).kids.T;
    pDVar8->ref = 0;
    pDVar8->next = pDVar9;
    pDVar9 = pDVar8;
  } while (moves != (DdNode *)0x0);
  table->nextFree = pDVar8;
  bVar17 = iVar2 == iVar12;
  iVar2 = iVar2 + 1;
  if (bVar17) {
    return 1;
  }
  goto LAB_0081aff6;
LAB_0081b372:
  do {
    pDVar10 = moves;
    moves = (pDVar10->type).kids.T;
    pDVar10->ref = 0;
    pDVar10->next = pDVar9;
    pDVar9 = pDVar10;
  } while (moves != (DdNode *)0x0);
LAB_0081b3ba:
  table->nextFree = pDVar10;
  return 0;
}

Assistant:

int
cuddZddSwapping(
  DdManager * table,
  int lower,
  int upper,
  Cudd_ReorderingType heuristic)
{
    int i, j;
    int max, keys;
    int nvars;
    int x, y;
    int iterate;
    int previousSize;
    Move *moves, *move;
    int pivot = -1;
    int modulo;
    int result;

#ifdef DD_DEBUG
    /* Sanity check */
    assert(lower >= 0 && upper < table->sizeZ && lower <= upper);
#endif

    nvars = upper - lower + 1;
    iterate = nvars;

    for (i = 0; i < iterate; i++) {
        if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
            /* Find pivot <= id with maximum keys. */
            for (max = -1, j = lower; j <= upper; j++) {
                if ((keys = table->subtableZ[j].keys) > max) {
                    max = keys;
                    pivot = j;
                }
            }

            modulo = upper - pivot;
            if (modulo == 0) {
                y = pivot;      /* y = nvars-1 */
            } else {
                /* y = random # from {pivot+1 .. nvars-1} */
                y = pivot + 1 + (int) (Cudd_Random() % modulo);
            }

            modulo = pivot - lower - 1;
            if (modulo < 1) {   /* if pivot = 1 or 0 */
                x = lower;
            } else {
                do { /* x = random # from {0 .. pivot-2} */
                    x = (int) Cudd_Random() % modulo;
                } while (x == y);
                  /* Is this condition really needed, since x and y
                     are in regions separated by pivot? */
            }
        } else {
            x = (int) (Cudd_Random() % nvars) + lower;
            do {
                y = (int) (Cudd_Random() % nvars) + lower;
            } while (x == y);
        }

        previousSize = table->keysZ;
        moves = zddSwapAny(table, x, y);
        if (moves == NULL)
            goto cuddZddSwappingOutOfMem;

        result = cuddZddSiftingBackward(table, moves, previousSize);
        if (!result)
            goto cuddZddSwappingOutOfMem;

        while (moves != NULL) {
            move = moves->next;
            cuddDeallocMove(table, moves);
            moves = move;
        }
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    return(1);

cuddZddSwappingOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(0);

}